

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O2

void __thiscall cmFileCopier::~cmFileCopier(cmFileCopier *this)

{
  ~cmFileCopier(this);
  operator_delete(this,0xf8);
  return;
}

Assistant:

cmFileCopier::~cmFileCopier() = default;